

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

istream * PyreNet::operator>>(istream *is,Layer *l)

{
  pointer pPVar1;
  activationType activation;
  ActivationFactory *this;
  Activation *pAVar2;
  Perceptron *p;
  pointer p_00;
  Perceptron local_70;
  undefined1 local_48 [8];
  string activationString;
  int nodesSize;
  
  this = ActivationFactory::getInstance();
  local_48 = (undefined1  [8])&activationString._M_string_length;
  activationString._M_dataplus._M_p = (pointer)0x0;
  activationString._M_string_length._0_1_ = 0;
  std::operator>>(is,(string *)local_48);
  activation = ActivationFactory::fromString((string *)local_48);
  pAVar2 = ActivationFactory::getActivation(this,activation);
  l->activation = pAVar2;
  std::istream::operator>>((istream *)is,(int *)(activationString.field_2._M_local_buf + 0xc));
  Perceptron::Perceptron(&local_70,0);
  std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::resize
            (&l->nodes,(long)(int)activationString.field_2._12_4_,&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_70);
  pPVar1 = (l->nodes).super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (p_00 = (l->nodes).
              super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
              super__Vector_impl_data._M_start; p_00 != pPVar1; p_00 = p_00 + 1) {
    operator>>(is,p_00);
  }
  std::__cxx11::string::~string((string *)local_48);
  return is;
}

Assistant:

std::istream& operator>>(std::istream& is, Layer &l) {
        ActivationFactory* activationFactory = ActivationFactory::getInstance();
        std::string activationString;
        is >> activationString;
        l.activation = activationFactory->getActivation(ActivationFactory::fromString(activationString));
        int nodesSize;
        is >> nodesSize;
        l.nodes.resize(nodesSize, Perceptron(0));
        for (Perceptron& p : l.nodes)
            is >> p;
        return is;
    }